

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vFrontier_local;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x9d9,
                  "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Ivy_ObjSatNum(pObj);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjSatNum(pObj);
    if (iVar1 != 0) {
      __assert_fail("Ivy_ObjSatNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x9dc,
                    "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    pVVar2 = Ivy_ObjFaninVec(pObj);
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      __assert_fail("Ivy_ObjFaninVec(pObj) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x9dd,
                    "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Ivy_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      Ivy_ObjSetSatNum(pObj,iVar1);
      iVar1 = Ivy_ObjIsNode(pObj);
      if (iVar1 != 0) {
        Vec_PtrPush(vFrontier,pObj);
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigObjAddToFrontier( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjSatNum(pObj) )
        return;
    assert( Ivy_ObjSatNum(pObj) == 0 );
    assert( Ivy_ObjFaninVec(pObj) == NULL );
    if ( Ivy_ObjIsConst1(pObj) )
        return;
//printf( "Assigning node %d number %d\n", pObj->Id, p->nSatVars );
    Ivy_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Ivy_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}